

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void custom_seqnum_test(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  fdb_iterator *in_stack_fffffffffffffb28;
  fdb_file_handle *in_stack_fffffffffffffb30;
  fdb_iterator *in_stack_fffffffffffffb38;
  size_t in_stack_fffffffffffffb50;
  fdb_kvs_handle *apfStack_488 [4];
  int local_464;
  fdb_doc **in_stack_fffffffffffffba0;
  fdb_iterator *in_stack_fffffffffffffba8;
  char local_418 [8];
  char tmp [16];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_iterator *iterator;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc real_doc;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kv;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  apfStack_488[3] = (fdb_kvs_handle *)0x1145e0;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  apfStack_488[3] = (fdb_kvs_handle *)0x1145ed;
  memleak_start();
  real_doc._72_8_ = &stack0xfffffffffffffb28;
  memset(&rdoc,0,0x50);
  real_doc.size_ondisk = (size_t)(bodybuf + 0xf8);
  real_doc.meta = &fconfig.num_blocks_readahead;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.wal_flush_before_commit = true;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  fdb_open((fdb_file_handle **)bodybuf._72_8_,(char *)bodybuf._64_8_,(fdb_config *)bodybuf._56_8_);
  if (multi_kv) {
    dbfile._0_4_ = 4;
    for (num_kv = 3; -1 < num_kv; num_kv = num_kv + -1) {
      sprintf(local_418,"kv%d",(ulong)(uint)num_kv);
      fVar1 = fdb_kvs_open((fdb_file_handle *)fconfig.num_keeping_headers,
                           (fdb_kvs_handle **)fconfig.max_block_reusing_cycle,
                           (char *)fconfig.min_block_reuse_filesize,
                           (fdb_kvs_config *)fconfig.block_reusing_threshold);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb3d);
        custom_seqnum_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb3d,"void custom_seqnum_test(bool)");
        }
      }
      fVar1 = fdb_set_log_callback(apfStack_488[num_kv],logCallbackFunc,"custom_seqnum_test");
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb40);
        custom_seqnum_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb40,"void custom_seqnum_test(bool)");
        }
      }
    }
  }
  else {
    dbfile._0_4_ = 1;
    fVar1 = fdb_kvs_open_default
                      (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->handle,
                       (fdb_kvs_config *)0x114881);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xb45);
      custom_seqnum_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb45,"void custom_seqnum_test(bool)");
      }
    }
    fVar1 = fdb_set_log_callback(apfStack_488[0],logCallbackFunc,"custom_seqnum_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xb48);
      custom_seqnum_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb48,"void custom_seqnum_test(bool)");
      }
    }
  }
  for (n = 0; n < 5; n = n + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(bodybuf + 0xf8);
    pvVar5 = (void *)0x114a27;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,pvVar5,sVar3 + 1,(void *)0x114a5c,
                   in_stack_fffffffffffffb50);
    num_kv = (int)dbfile;
    while (num_kv = num_kv + -1, -1 < num_kv) {
      fVar1 = fdb_set(apfStack_488[num_kv],*(fdb_doc **)(real_doc._72_8_ + (long)n * 8));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb52);
        custom_seqnum_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb52,"void custom_seqnum_test(bool)");
        }
      }
    }
  }
  for (n = 5; num_kv = (int)dbfile, n < 10; n = n + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    in_stack_fffffffffffffba0 = (fdb_doc **)(real_doc._72_8_ + (long)n * 8);
    in_stack_fffffffffffffba8 = (fdb_iterator *)(bodybuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar5 = (void *)0x114bbe;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,pvVar5,sVar3 + 1,(void *)0x114bf3,
                   in_stack_fffffffffffffb50);
    while (num_kv = num_kv + -1, -1 < num_kv) {
      fdb_doc_set_seqnum(*(fdb_doc **)(real_doc._72_8_ + (long)n * 8),(long)((n + 1) * 2));
      fVar1 = fdb_set(apfStack_488[num_kv],*(fdb_doc **)(real_doc._72_8_ + (long)n * 8));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb5e);
        custom_seqnum_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb5e,"void custom_seqnum_test(bool)");
        }
      }
    }
  }
  do {
    num_kv = num_kv + -1;
    if (num_kv < 0) {
      fdb_compact(in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
      n = 5;
      do {
        if (9 < n) {
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffb28);
          for (n = 0; n < 10; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x11517b);
          }
          fdb_shutdown();
          memleak_end();
          pcVar4 = "single kv instance";
          if (multi_kv) {
            pcVar4 = "multiple kv instances";
          }
          sprintf((char *)&fconfig.num_blocks_readahead,"Custom sequence number test %s",pcVar4);
          if (custom_seqnum_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n",&fconfig.num_blocks_readahead);
          }
          else {
            fprintf(_stderr,"%s PASSED\n",&fconfig.num_blocks_readahead);
          }
          return;
        }
        sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
        num_kv = (int)dbfile;
        while (num_kv = num_kv + -1, -1 < num_kv) {
          real_doc.key = (void *)(long)((n + 1) * 2);
          fVar1 = fdb_get_byseq(apfStack_488[num_kv],(fdb_doc *)&rdoc);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xb7f);
            custom_seqnum_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xb7f,"void custom_seqnum_test(bool)");
            }
          }
        }
        n = n + 1;
      } while( true );
    }
    fdb_iterator_init(apfStack_488[num_kv],(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,
                      (void *)0x0,0,0);
    n = 0;
    do {
      fVar1 = fdb_iterator_get(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb68);
        custom_seqnum_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb68,"void custom_seqnum_test(bool)");
        }
      }
      iVar2 = memcmp((void *)real_doc.size_ondisk,
                     *(void **)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x20),(size_t)rdoc);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x20),
                real_doc.size_ondisk,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb69);
        custom_seqnum_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb69,"void custom_seqnum_test(bool)");
      }
      iVar2 = memcmp(real_doc.meta,*(void **)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x40),
                     real_doc.metalen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(real_doc._72_8_ + (long)n * 8) + 0x40),real_doc.meta,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb6a);
        custom_seqnum_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb6a,"void custom_seqnum_test(bool)");
      }
      n = n + 1;
      local_464 = n;
      if (n < 6) {
        if (real_doc.key != (void *)(long)n) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xb6d);
          custom_seqnum_test::__test_pass = 0;
          if (real_doc.key != (void *)(long)n) {
            __assert_fail("rdoc->seqnum == (fdb_seqnum_t)i",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xb6d,"void custom_seqnum_test(bool)");
          }
        }
      }
      else if (real_doc.key != (void *)((long)n * 2)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb6f);
        custom_seqnum_test::__test_pass = 0;
        if (real_doc.key != (void *)((long)n * 2)) {
          __assert_fail("rdoc->seqnum == (fdb_seqnum_t)i*2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb6f,"void custom_seqnum_test(bool)");
        }
      }
      fVar1 = fdb_iterator_next(in_stack_fffffffffffffb28);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(in_stack_fffffffffffffb38);
    fdb_commit((fdb_file_handle *)in_stack_fffffffffffffb28,'\0');
  } while( true );
}

Assistant:

void custom_seqnum_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "custom_seqnum_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "custom_seqnum_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n/2; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            fdb_doc_set_seqnum(doc[i], (i+1)*2); // double seqnum instead of ++
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            ++i;
            if (i <= n/2) {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i);
            } else {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i*2);
            }
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            rdoc->seqnum = (i + 1)*2;
            status = fdb_get_byseq(db[r], rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Custom sequence number test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}